

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

void __thiscall snappy::SnappySinkAllocator::Flush(SnappySinkAllocator *this,size_t size)

{
  Sink *pSVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  unsigned_long *puVar5;
  unsigned_long local_38;
  int local_2c;
  unsigned_long uStack_28;
  int i;
  size_t block_size;
  size_t size_written;
  size_t size_local;
  SnappySinkAllocator *this_local;
  
  block_size = 0;
  local_2c = 0;
  size_written = size;
  size_local = (size_t)this;
  while( true ) {
    uVar2 = (ulong)local_2c;
    sVar3 = std::
            vector<snappy::SnappySinkAllocator::Datablock,_std::allocator<snappy::SnappySinkAllocator::Datablock>_>
            ::size(&this->blocks_);
    if (sVar3 <= uVar2) break;
    pvVar4 = std::
             vector<snappy::SnappySinkAllocator::Datablock,_std::allocator<snappy::SnappySinkAllocator::Datablock>_>
             ::operator[](&this->blocks_,(long)local_2c);
    local_38 = size_written - block_size;
    puVar5 = std::min<unsigned_long>(&pvVar4->size,&local_38);
    uStack_28 = *puVar5;
    pSVar1 = this->dest_;
    pvVar4 = std::
             vector<snappy::SnappySinkAllocator::Datablock,_std::allocator<snappy::SnappySinkAllocator::Datablock>_>
             ::operator[](&this->blocks_,(long)local_2c);
    (*pSVar1->_vptr_Sink[4])(pSVar1,pvVar4->data,uStack_28,Deleter,0);
    block_size = uStack_28 + block_size;
    local_2c = local_2c + 1;
  }
  std::
  vector<snappy::SnappySinkAllocator::Datablock,_std::allocator<snappy::SnappySinkAllocator::Datablock>_>
  ::clear(&this->blocks_);
  return;
}

Assistant:

void Flush(size_t size) {
    size_t size_written = 0;
    size_t block_size;
    for (int i = 0; i < blocks_.size(); ++i) {
      block_size = min<size_t>(blocks_[i].size, size - size_written);
      dest_->AppendAndTakeOwnership(blocks_[i].data, block_size,
                                    &SnappySinkAllocator::Deleter, NULL);
      size_written += block_size;
    }
    blocks_.clear();
  }